

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O2

configInfo * glcts::parseConfigBitsFromName(configInfo *__return_storage_ptr__,char *configName)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  
  lVar4 = -0x10;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x18 == 0x38) goto LAB_0091a379;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::colorCfgs[0].blueBits + lVar7);
    sVar6 = strlen(pcVar1);
    iVar5 = strncmp(configName,pcVar1,sVar6);
    lVar4 = lVar7 + 0x18;
  } while (iVar5 != 0);
  uVar2 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[1].name + lVar7);
  uVar3 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[1].redBits + lVar7);
  __return_storage_ptr__->redBits = (int)uVar2;
  __return_storage_ptr__->greenBits = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->blueBits = (int)uVar3;
  __return_storage_ptr__->alphaBits = (int)((ulong)uVar3 >> 0x20);
  configName = configName + sVar6;
LAB_0091a379:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x30) goto LAB_0091a3bb;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::depthCfgs[0].name + lVar7);
    sVar6 = strlen(pcVar1);
    iVar5 = strncmp(configName,pcVar1,sVar6);
    lVar4 = lVar7 + 0x10;
  } while (iVar5 != 0);
  __return_storage_ptr__->depthBits =
       *(deInt32 *)((long)&parseConfigBitsFromName::depthCfgs[0].depthBits + lVar7);
  configName = configName + sVar6;
LAB_0091a3bb:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x30) goto LAB_0091a3fd;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::stencilCfgs[0].name + lVar7);
    sVar6 = strlen(pcVar1);
    iVar5 = strncmp(configName,pcVar1,sVar6);
    lVar4 = lVar7 + 0x10;
  } while (iVar5 != 0);
  __return_storage_ptr__->stencilBits =
       *(deInt32 *)((long)&parseConfigBitsFromName::stencilCfgs[0].stencilBits + lVar7);
  configName = configName + sVar6;
LAB_0091a3fd:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x30) {
      return __return_storage_ptr__;
    }
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::multiSampleCfgs[0].name + lVar7);
    sVar6 = strlen(pcVar1);
    iVar5 = strncmp(configName,pcVar1,sVar6);
    lVar4 = lVar7 + 0x10;
  } while (iVar5 != 0);
  __return_storage_ptr__->samples =
       *(deInt32 *)((long)&parseConfigBitsFromName::multiSampleCfgs[0].samples + lVar7);
  return __return_storage_ptr__;
}

Assistant:

static configInfo parseConfigBitsFromName(const char* configName)
{
	configInfo cfgInfo;
	static const struct
	{
		const char* name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] = {
		{ "rgba8888", 8, 8, 8, 8 }, { "rgb565", 5, 6, 5, 0 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (!strncmp(configName, colorCfgs[ndx].name, strlen(colorCfgs[ndx].name)))
		{
			cfgInfo.redBits   = colorCfgs[ndx].redBits;
			cfgInfo.greenBits = colorCfgs[ndx].greenBits;
			cfgInfo.blueBits  = colorCfgs[ndx].blueBits;
			cfgInfo.alphaBits = colorCfgs[ndx].alphaBits;

			configName += strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			depthBits;
	} depthCfgs[] = {
		{ "d0", 0 }, { "d24", 24 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (!strncmp(configName, depthCfgs[ndx].name, strlen(depthCfgs[ndx].name)))
		{
			cfgInfo.depthBits = depthCfgs[ndx].depthBits;

			configName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			stencilBits;
	} stencilCfgs[] = {
		{ "s0", 0 }, { "s8", 8 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (!strncmp(configName, stencilCfgs[ndx].name, strlen(stencilCfgs[ndx].name)))
		{
			cfgInfo.stencilBits = stencilCfgs[ndx].stencilBits;

			configName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			samples;
	} multiSampleCfgs[] = {
		{ "ms0", 0 }, { "ms4", 4 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (!strncmp(configName, multiSampleCfgs[ndx].name, strlen(multiSampleCfgs[ndx].name)))
		{
			cfgInfo.samples = multiSampleCfgs[ndx].samples;

			configName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	return cfgInfo;
}